

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c-wrapper.h
# Opt level: O0

string * __thiscall
wasm::generateWasm2CWrapper_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Module *wasm)

{
  size_t *this_00;
  wasm *pwVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  BasicType BVar5;
  pointer pEVar6;
  Name *pNVar7;
  Fatal *this_01;
  Type in_R9;
  Signature sig;
  Signature SVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  Name NVar10;
  Name name;
  BasicType local_40c;
  undefined8 local_408;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  bool first;
  string local_3a0;
  Fatal local_380;
  string local_1f8;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  BasicType local_16c;
  Type local_168;
  Type result;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  char *local_d8;
  char *pcStack_d0;
  Function *local_c0;
  Function *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  reference local_58;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  size_t functionExportIndex;
  allocator<char> local_1a;
  undefined1 local_19;
  wasm *local_18;
  Module *wasm_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  wasm_local = (Module *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "\n#include <inttypes.h>\n#include <stdint.h>\n#include <stdio.h>\n\n#include \"wasm-rt-impl.h\"\n#include \"wasm.h\"\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi(u32 x) {\n  printf(\"[LoggingExternalInterface logging %d]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi)(u32) = _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj(u64 x) {\n  printf(\"[LoggingExternalInterface logging %\" PRId64 \"]\\n\", (int64_t)x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj)(u64) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii(u32 x, u32 y) {\n  printf(\"[LoggingExternalInterface logging %d %d]\\n\", x, y);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii)(u32, u32) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf(f32 x) {\n  printf(\"[LoggingExternalInterface logging %.17e]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf)(f32) = _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd(f64 x) {\n  printf(\"[LoggingExternalInterface logging %.17le]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd)(f64) = _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd;\n\n// Miscellaneous imports\n\nu32 tempRet0 = 0;\n\nvoid _Z_envZ_setTempRet0Z_vi(u32 x) {\n  tempRet0 = x;\n}\nvoid (*Z_envZ_setTempRet0Z_vi)(u32) = _Z_envZ_setTempRet0Z_vi;\n\nu32 _Z_envZ_getTempRet0Z_iv(void) {\n  return tempRet0;\n}\nu32 (*Z_envZ_getTempRet0Z_iv)(void) = _Z_envZ_getTempRet0Z_iv;\n\n// Main\n\nint main(int argc, char** argv) {\n  init();\n\n  // We go through each export and call it, in turn. Note that we use a loop\n  // so we can do all this with a single setjmp. A setjmp is needed to handle\n  // wasm traps, and emitting a single one helps compilation speed into wasm as\n  // compile times are O(size * num_setjmps).\n  for (size_t curr = 0;; curr++) {\n  "
             ,&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "\n    // Prepare to call the export, so we can catch traps.\n    if (WASM_RT_SETJMP(g_jmp_buf) != 0) {\n      puts(\"exception!\");\n    } else {\n      // Call the proper export.\n      switch(curr) {\n"
            );
  pwVar1 = local_18;
  __range1 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              *)0x0;
  __end1 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)local_18);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               *)pwVar1);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                *)&exp);
    if (!bVar3) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 "        default:\n          return 0; // All done.\n      }\n    }\n  }\n  return 0;\n}\n"
                );
      return __return_storage_ptr__;
    }
    local_58 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
               ::operator*(&__end1);
    pEVar6 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(local_58)
    ;
    if (pEVar6->kind == Function) {
      std::__cxx11::to_string((string *)&func,(unsigned_long)__range1);
      std::operator+(&local_98,"        case ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func);
      std::operator+(&local_78,&local_98,":\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&func);
      pwVar1 = local_18;
      pEVar6 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_58);
      pNVar7 = Export::getInternalName(pEVar6);
      local_d8 = (char *)(pNVar7->super_IString).str._M_len;
      pcStack_d0 = (pNVar7->super_IString).str._M_str;
      NVar10.super_IString.str._M_str = local_d8;
      NVar10.super_IString.str._M_len = (size_t)pwVar1;
      local_c0 = (Function *)::wasm::Module::getFunction(NVar10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"          puts(\"[fuzz-exec] calling ",&local_139);
      pEVar6 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_58);
      IString::toString_abi_cxx11_((string *)&result,(IString *)pEVar6);
      std::operator+(&local_118,&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
      std::operator+(&local_f8,&local_118,"\");\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      local_168 = Function::getResults(local_c0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"            ");
      local_16c = none;
      bVar3 = Type::operator!=(&local_168,&local_16c);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"printf(\"[fuzz-exec] note result: ",&local_1d1);
        pEVar6 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (local_58);
        IString::toString_abi_cxx11_(&local_1f8,(IString *)pEVar6);
        std::operator+(&local_1b0,&local_1d0,&local_1f8);
        std::operator+(&local_190,&local_1b0," => ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator(&local_1d1);
        bVar3 = Type::isTuple(&local_168);
        if (bVar3) {
          __assert_fail("!result.isTuple() && \"Unexpected tuple type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2c-wrapper.h"
                        ,0xab,"std::string wasm::generateWasm2CWrapper(Module &)");
        }
        bVar3 = Type::isBasic(&local_168);
        if (!bVar3) {
          __assert_fail("result.isBasic() && \"TODO: handle compound types\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2c-wrapper.h"
                        ,0xab,"std::string wasm::generateWasm2CWrapper(Module &)");
        }
        BVar5 = Type::getBasic(&local_168);
        switch(BVar5) {
        case i32:
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%d\\n\", ");
          break;
        case i64:
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,"%\" PRId64 \"\\n\", (int64_t)");
          break;
        case f32:
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%.17e\\n\", ");
          break;
        case f64:
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%.17le\\n\", ");
          break;
        default:
          Fatal::Fatal(&local_380);
          this_01 = Fatal::operator<<(&local_380,
                                      (char (*) [39])"unhandled wasm2c wrapper result type: ");
          Fatal::operator<<(this_01,&local_168);
          Fatal::~Fatal(&local_380);
        }
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(*");
      pEVar6 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_58);
      pwVar1 = (wasm *)(pEVar6->name).super_IString.str._M_len;
      pcVar2 = (pEVar6->name).super_IString.str._M_str;
      SVar8 = Function::getSig(local_c0);
      sig.results.id = in_R9.id;
      sig.params.id = SVar8.results.id.id;
      name.super_IString.str._M_str = (char *)SVar8.params.id.id;
      name.super_IString.str._M_len = (size_t)pcVar2;
      wasm2cMangle_abi_cxx11_(&local_3a0,pwVar1,name,sig);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")(");
      bVar3 = true;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)Function::getParams(local_c0);
      this_00 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      join_0x00000010_0x00000000_ =
           (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           Type::begin((Type *)this_00);
      PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              Type::end((Type *)this_00);
      while( true ) {
        __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)PVar9.index;
        param = PVar9.parent;
        bVar4 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                          ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                           &__end2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                  &param);
        if (!bVar4) break;
        local_408 = ::wasm::Type::Iterator::operator*
                              ((Iterator *)
                               &__end2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index);
        if (!bVar3) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"0");
        bVar3 = false;
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                   &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  );
        PVar9.index = (size_t)__end2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent;
        PVar9.parent = param;
      }
      local_40c = none;
      bVar3 = Type::operator!=(&local_168,&local_40c);
      if (bVar3) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,");\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"          break;\n");
      __range1 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  *)((long)&(__range1->
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

inline std::string generateWasm2CWrapper(Module& wasm) {
  // First, emit implementations of the wasm's imports so that the wasm2c code
  // can call them. The names use wasm2c's name mangling.
  std::string ret = R"(
#include <inttypes.h>
#include <stdint.h>
#include <stdio.h>

#include "wasm-rt-impl.h"
#include "wasm.h"

void _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi(u32 x) {
  printf("[LoggingExternalInterface logging %d]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi)(u32) = _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi;

void _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj(u64 x) {
  printf("[LoggingExternalInterface logging %" PRId64 "]\n", (int64_t)x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj)(u64) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj;

void _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii(u32 x, u32 y) {
  printf("[LoggingExternalInterface logging %d %d]\n", x, y);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii)(u32, u32) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii;

void _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf(f32 x) {
  printf("[LoggingExternalInterface logging %.17e]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf)(f32) = _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf;

void _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd(f64 x) {
  printf("[LoggingExternalInterface logging %.17le]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd)(f64) = _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd;

// Miscellaneous imports

u32 tempRet0 = 0;

void _Z_envZ_setTempRet0Z_vi(u32 x) {
  tempRet0 = x;
}
void (*Z_envZ_setTempRet0Z_vi)(u32) = _Z_envZ_setTempRet0Z_vi;

u32 _Z_envZ_getTempRet0Z_iv(void) {
  return tempRet0;
}
u32 (*Z_envZ_getTempRet0Z_iv)(void) = _Z_envZ_getTempRet0Z_iv;

// Main

int main(int argc, char** argv) {
  init();

  // We go through each export and call it, in turn. Note that we use a loop
  // so we can do all this with a single setjmp. A setjmp is needed to handle
  // wasm traps, and emitting a single one helps compilation speed into wasm as
  // compile times are O(size * num_setjmps).
  for (size_t curr = 0;; curr++) {
  )";
  ret += R"(
    // Prepare to call the export, so we can catch traps.
    if (WASM_RT_SETJMP(g_jmp_buf) != 0) {
      puts("exception!");
    } else {
      // Call the proper export.
      switch(curr) {
)";

  // For each function export in the wasm, emit code to call it and log its
  // result, similar to the other wrappers.
  size_t functionExportIndex = 0;

  for (auto& exp : wasm.exports) {
    if (exp->kind != ExternalKind::Function) {
      continue;
    }

    ret += "        case " + std::to_string(functionExportIndex++) + ":\n";

    auto* func = wasm.getFunction(*exp->getInternalName());

    ret += std::string("          puts(\"[fuzz-exec] calling ") +
           exp->name.toString() + "\");\n";
    auto result = func->getResults();

    // Emit the call itself.
    ret += "            ";
    if (result != Type::none) {
      ret += std::string("printf(\"[fuzz-exec] note result: ") +
             exp->name.toString() + " => ";
      TODO_SINGLE_COMPOUND(result);
      switch (result.getBasic()) {
        case Type::i32:
          ret += "%d\\n\", ";
          break;
        case Type::i64:
          ret += "%\" PRId64 \"\\n\", (int64_t)";
          break;
        case Type::f32:
          ret += "%.17e\\n\", ";
          break;
        case Type::f64:
          ret += "%.17le\\n\", ";
          break;
        default:
          Fatal() << "unhandled wasm2c wrapper result type: " << result;
      }
    }

    // Call the export.
    ret += "(*";

    // Emit the callee's name with wasm2c name mangling.
    ret += wasm2cMangle(exp->name, func->getSig());

    ret += ")(";

    // Emit the parameters (all 0s, like the other wrappers).
    bool first = true;
    for ([[maybe_unused]] const auto& param : func->getParams()) {
      if (!first) {
        ret += ", ";
      }
      ret += "0";
      first = false;
    }
    if (result != Type::none) {
      ret += ")";
    }
    ret += ");\n";

    // Break from the big switch.
    ret += "          break;\n";
  }

  ret += R"(        default:
          return 0; // All done.
      }
    }
  }
  return 0;
}
)";

  return ret;
}